

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O0

double __thiscall sector_t::FindShortestUpperAround(sector_t *this)

{
  FTextureID FVar1;
  int iVar2;
  FTexture *this_00;
  double local_38;
  int local_1c;
  double dStack_18;
  int i;
  double minsize;
  sector_t_conflict *this_local;
  
  dStack_18 = 3.4028234663852886e+38;
  minsize = (double)this;
  for (local_1c = 0; local_1c < this->linecount; local_1c = local_1c + 1) {
    if ((this->lines[local_1c]->flags & 4) != 0) {
      FVar1 = side_t::GetTexture(this->lines[local_1c]->sidedef[0],0);
      CheckShortestTex(FVar1,&stack0xffffffffffffffe8);
      FVar1 = side_t::GetTexture(this->lines[local_1c]->sidedef[1],0);
      CheckShortestTex(FVar1,&stack0xffffffffffffffe8);
    }
  }
  if (3.4028234663852886e+38 <= dStack_18) {
    this_00 = FTextureManager::operator[](&TexMan,(char *)0x0);
    iVar2 = FTexture::GetHeight(this_00);
    local_38 = (double)iVar2;
  }
  else {
    local_38 = dStack_18;
  }
  return local_38;
}

Assistant:

double sector_t::FindShortestUpperAround () const
{
	double minsize = FLT_MAX;

	for (int i = 0; i < linecount; i++)
	{
		if (lines[i]->flags & ML_TWOSIDED)
		{
			CheckShortestTex (lines[i]->sidedef[0]->GetTexture(side_t::top), minsize);
			CheckShortestTex (lines[i]->sidedef[1]->GetTexture(side_t::top), minsize);
		}
	}
	return minsize < FLT_MAX ? minsize : TexMan[0]->GetHeight();
}